

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O0

void __thiscall
packing::AssignedProtos::
addUniqueColors<packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,std::remove_const_t>>
          (AssignedProtos *this,
          unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
          *colors,Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                  iter,
          Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
          *end,vector<ProtoPalette,_std::allocator<ProtoPalette>_> *protoPals)

{
  bool bVar1;
  pointer prVar2;
  const_reference this_00;
  const_iterator __first;
  const_iterator __last;
  ProtoPalette *protoPal;
  vector<ProtoPalette,_std::allocator<ProtoPalette>_> *protoPals_local;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  *end_local;
  unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
  *colors_local;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  iter_local;
  
  iter_local._array = iter._array;
  colors_local = colors;
  while( true ) {
    bVar1 = Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
            ::operator!=((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                          *)&colors_local,
                         (Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                          *)iter._iter._M_current._M_current);
    if (!bVar1) break;
    prVar2 = Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
             ::operator->((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                           *)&colors_local);
    this_00 = std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::operator[]
                        ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)end,
                         prVar2->protoPalIndex);
    __first = ProtoPalette::begin(this_00);
    __last = ProtoPalette::end(this_00);
    std::
    unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>
    ::insert<unsigned_short_const*>
              ((unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>
                *)this,__first,__last);
    Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
    ::operator++((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                  *)&colors_local);
  }
  return;
}

Assistant:

static void addUniqueColors(std::unordered_set<uint16_t> &colors, Iter iter, Iter const &end,
	                            std::vector<ProtoPalette> const &protoPals) {
		for (; iter != end; ++iter) {
			ProtoPalette const &protoPal = protoPals[iter->protoPalIndex];
			colors.insert(protoPal.begin(), protoPal.end());
		}
	}